

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding2.c
# Opt level: O3

size_t objc_aligned_size(char *type)

{
  ulong uVar1;
  size_t size;
  size_t local_28;
  
  local_28 = 0;
  sizeof_type(type,&local_28);
  uVar1 = local_28 >> 3;
  local_28 = 0;
  alignof_type(type,&local_28);
  return uVar1 + uVar1 % (local_28 >> 3);
}

Assistant:

OBJC_PUBLIC
size_t objc_aligned_size(const char *type)
{
	size_t size  = objc_sizeof_type(type);
	size_t align = objc_alignof_type(type);
	return size + (size % align);
}